

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesCommand.cxx
# Opt level: O1

string * FindInstallSource_abi_cxx11_
                   (string *__return_storage_ptr__,cmMakefile *makefile,char *name)

{
  string *psVar1;
  bool bVar2;
  size_type sVar3;
  string *psVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_type *psVar6;
  bool bVar7;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string ts;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  string *local_d8;
  string local_d0;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined1 *local_a0;
  undefined1 local_98 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_78;
  undefined8 local_60;
  undefined1 *local_58;
  undefined8 local_50;
  size_t local_48;
  char *local_40;
  undefined8 local_38;
  
  bVar2 = cmsys::SystemTools::FileIsFullPath(name);
  bVar7 = true;
  if (!bVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,name,&local_119);
    sVar3 = cmGeneratorExpression::Find(&local_d0);
    bVar7 = sVar3 == 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar7) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,name,(allocator<char> *)&local_78);
    return __return_storage_ptr__;
  }
  local_d8 = __return_storage_ptr__;
  psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(makefile);
  local_78.first._M_str = (psVar4->_M_dataplus)._M_p;
  local_78.first._M_len = psVar4->_M_string_length;
  local_78.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b0 = 0;
  local_a8 = 1;
  local_98[0] = 0x2f;
  local_60 = 1;
  local_50 = 0;
  local_a0 = local_98;
  local_58 = local_98;
  local_48 = strlen(name);
  local_38 = 0;
  views._M_len = 3;
  views._M_array = &local_78;
  local_40 = name;
  cmCatViews(&local_118,views);
  psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(makefile);
  local_78.first._M_str = (psVar4->_M_dataplus)._M_p;
  local_78.first._M_len = psVar4->_M_string_length;
  local_78.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b0 = 0;
  local_a8 = 1;
  local_98[0] = 0x2f;
  local_60 = 1;
  local_50 = 0;
  local_a0 = local_98;
  local_58 = local_98;
  local_48 = strlen(name);
  local_38 = 0;
  views_00._M_len = 3;
  views_00._M_array = &local_78;
  local_40 = name;
  cmCatViews(&local_f8,views_00);
  bVar7 = cmsys::SystemTools::FileExists(&local_118);
  psVar4 = local_d8;
  if (bVar7) {
    (local_d8->_M_dataplus)._M_p = (pointer)&local_d8->field_2;
  }
  else {
    bVar7 = cmsys::SystemTools::FileExists(&local_f8);
    (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
    if (bVar7) {
      paVar5 = &local_f8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p == paVar5) {
        (psVar4->field_2)._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&psVar4->field_2 + 8) = local_f8.field_2._8_8_;
      }
      else {
        (psVar4->_M_dataplus)._M_p = local_f8._M_dataplus._M_p;
        (psVar4->field_2)._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
      }
      psVar1 = &local_f8;
      goto LAB_003a11fb;
    }
  }
  paVar5 = &local_118.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p == paVar5) {
    (psVar4->field_2)._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&psVar4->field_2 + 8) = local_118.field_2._8_8_;
  }
  else {
    (psVar4->_M_dataplus)._M_p = local_118._M_dataplus._M_p;
    (psVar4->field_2)._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
  }
  psVar1 = &local_118;
LAB_003a11fb:
  psVar6 = &psVar1->_M_string_length;
  psVar4->_M_string_length = *psVar6;
  (((string *)(psVar6 + -1))->_M_dataplus)._M_p = (pointer)paVar5;
  *psVar6 = 0;
  paVar5->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  return psVar4;
}

Assistant:

static std::string FindInstallSource(cmMakefile& makefile, const char* name)
{
  if (cmSystemTools::FileIsFullPath(name) ||
      cmGeneratorExpression::Find(name) == 0) {
    // This is a full path.
    return name;
  }

  // This is a relative path.
  std::string tb = cmStrCat(makefile.GetCurrentBinaryDirectory(), '/', name);
  std::string ts = cmStrCat(makefile.GetCurrentSourceDirectory(), '/', name);

  if (cmSystemTools::FileExists(tb)) {
    // The file exists in the binary tree.  Use it.
    return tb;
  }
  if (cmSystemTools::FileExists(ts)) {
    // The file exists in the source tree.  Use it.
    return ts;
  }
  // The file doesn't exist.  Assume it will be present in the
  // binary tree when the install occurs.
  return tb;
}